

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

string * __thiscall
spv::SpvBuildLogger::getAllMessages_abi_cxx11_(string *__return_storage_ptr__,SpvBuildLogger *this)

{
  ostream *poVar1;
  pointer pbVar2;
  ostringstream messages;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  pbVar2 = (this->tbdFeatures).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (this->tbdFeatures).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,"TBD functionality: ",0x13);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)aoStack_1a8,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (this->tbdFeatures).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pbVar2 = (this->missingFeatures).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (this->missingFeatures).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,"Missing functionality: ",0x17);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)aoStack_1a8,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (this->missingFeatures).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pbVar2 = (this->warnings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (this->warnings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,"warning: ",9);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)aoStack_1a8,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (this->warnings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pbVar2 = (this->errors).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (this->errors).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,"error: ",7);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)aoStack_1a8,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (this->errors).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string SpvBuildLogger::getAllMessages() const {
    std::ostringstream messages;
    for (auto it = tbdFeatures.cbegin(); it != tbdFeatures.cend(); ++it)
        messages << "TBD functionality: " << *it << "\n";
    for (auto it = missingFeatures.cbegin(); it != missingFeatures.cend(); ++it)
        messages << "Missing functionality: " << *it << "\n";
    for (auto it = warnings.cbegin(); it != warnings.cend(); ++it)
        messages << "warning: " << *it << "\n";
    for (auto it = errors.cbegin(); it != errors.cend(); ++it)
        messages << "error: " << *it << "\n";
    return messages.str();
}